

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

void level_tele(void)

{
  bool bVar1;
  d_level dVar2;
  schar sVar3;
  boolean bVar4;
  char cVar5;
  xchar xVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  s_level *psVar11;
  obj *poVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  d_level *src;
  char *pcVar19;
  int iVar20;
  bool bVar21;
  d_level newlevel;
  xchar destdnum;
  schar destlev;
  char buf [256];
  char qbuf [256];
  obj *in_stack_fffffffffffffdb8;
  d_level local_23c;
  xchar local_23a;
  schar local_239;
  undefined2 local_238;
  char cStack_236;
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  char acStack_230 [248];
  char local_138 [264];
  
  if (((((u.uhave._0_1_ & 1) != 0) || (u.uz.dnum == dungeon_topology.d_astral_level.dnum)) ||
      (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) && (flags.debug == '\0')) {
    pline("You feel very disoriented for a moment.");
    return;
  }
  if ((((u.uprops[0xf].extrinsic != 0 || u.uprops[0xf].intrinsic != 0) ||
       (((youmonst.data)->mflags1 & 0x4000000) != 0)) &&
      ((u.uprops[0x1b].intrinsic == 0 && ((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c'))))
      )) || (flags.debug != '\0')) {
    builtin_strncpy(local_138,"To what level do you want to teleport?",0x27);
    uVar18 = 0;
    bVar1 = false;
    do {
      bVar4 = flags.debug;
      if (uVar18 == 1) {
        sVar9 = strlen(local_138);
        if (bVar4 == '\0') {
          builtin_strncpy(local_138 + sVar9," [type a number]",0x11);
        }
        else {
          builtin_strncpy(local_138 + sVar9," [type a number or ? for a menu]",0x21);
        }
      }
      getlin(local_138,(char *)&local_238);
      iVar20 = 4;
      iVar15 = 4;
      if (local_238 == 0x2a) goto LAB_00259a1b;
      if (local_238 == 0x1b) {
        if (u.uprops[0x1c].intrinsic != 0) {
          uVar18 = mt_random();
          uVar18 = uVar18 % 5;
          lVar16 = (long)u.uluck;
          lVar10 = (long)u.moreluck;
          if ((int)(lVar10 + lVar16) != 0) {
            uVar7 = mt_random();
            if (SUB168(ZEXT416(uVar7) % SEXT816(0x32 - (lVar10 + lVar16)),0) != 0) {
              iVar17 = (int)u.moreluck + (int)u.uluck;
              iVar15 = iVar17 / 3;
              if (iVar17 < -5) {
                iVar15 = iVar17;
              }
              uVar7 = uVar18 - iVar15;
              uVar18 = 0;
              if ((-1 < (int)uVar7) && (uVar18 = 4, (int)uVar7 < 4)) {
                uVar18 = uVar7;
              }
            }
          }
          if (uVar18 != 0) goto LAB_00259a03;
        }
        iVar15 = 1;
        goto LAB_00259a1b;
      }
      if (u.uprops[0x1c].intrinsic != 0) {
        uVar7 = mt_random();
        uVar7 = uVar7 % 5;
        lVar16 = (long)u.uluck;
        lVar10 = (long)u.moreluck;
        if (((int)(lVar10 + lVar16) != 0) &&
           (uVar8 = mt_random(), SUB168(ZEXT416(uVar8) % SEXT816(0x32 - (lVar10 + lVar16)),0) != 0))
        {
          iVar14 = (int)u.moreluck + (int)u.uluck;
          iVar17 = iVar14 / 3;
          if (iVar14 < -5) {
            iVar17 = iVar14;
          }
          uVar7 = uVar7 - iVar17;
          if ((int)uVar7 < 0) {
            uVar7 = 0;
          }
          else if (3 < (int)uVar7) {
            uVar7 = 4;
          }
        }
        if (uVar7 == 0) goto LAB_00259605;
LAB_00259a03:
        pcVar19 = "Oops...";
        iVar17 = 0;
LAB_00259a0c:
        pline(pcVar19);
        goto LAB_00259a1d;
      }
LAB_00259605:
      if ((flags.debug == '\0') || (local_238 != 0x3f)) {
        sVar3 = lev_by_name((char *)&local_238);
        if (sVar3 == '\0') {
          iVar17 = atoi((char *)&local_238);
        }
        else {
          iVar17 = (int)sVar3;
        }
      }
      else {
        local_239 = '\0';
        local_23a = '\0';
        sVar3 = print_dungeon('\x01',&local_239,&local_23a);
        if (sVar3 != '\0') {
          local_23c.dlevel = local_239;
          local_23c.dnum = local_23a;
          bVar1 = true;
          if (local_23a == dungeon_topology.d_astral_level.dnum) {
            if (u.uz.dnum != dungeon_topology.d_astral_level.dnum) {
              psVar11 = get_first_elemental_plane();
              builtin_strncpy(acStack_230 + 0x18,"lane",5);
              local_238._0_1_ = 'D';
              local_238._1_1_ = 'e';
              cStack_236 = 's';
              cStack_235 = 't';
              cStack_234 = 'i';
              cStack_233 = 'n';
              cStack_232 = 'a';
              cStack_231 = 't';
              builtin_strncpy(acStack_230,"ion is first elemental p",0x18);
              if (((u.uhave._0_1_ & 1) == 0) &&
                 (poVar12 = mksobj(level,0xd9,'\x01','\0'), poVar12 != (obj *)0x0)) {
                addinv(in_stack_fffffffffffffdb8);
                sVar9 = strlen((char *)&local_238);
                builtin_strncpy((char *)((long)&local_238 + sVar9)," with th",8);
                builtin_strncpy(acStack_230 + sVar9,"e amulet",9);
              }
              src = &psVar11->dlevel;
              if (psVar11 == (s_level *)0x0) {
                src = (d_level *)0x0;
              }
              assign_level(&local_23c,src);
              pline("%s.");
            }
            bVar1 = true;
          }
        }
        iVar17 = (int)sVar3;
        if (sVar3 == '\0') {
          iVar20 = 1;
          goto LAB_00259a1d;
        }
      }
      if (iVar17 != 0) {
        if ((u.uz.dnum != '\0' && (0 < iVar17 && flags.debug == '\0')) &&
           (iVar15 = dungeons[u.uz.dnum].depth_start, xVar6 = dunlevs_in_dungeon(&u.uz),
           xVar6 + iVar15 < iVar17)) {
          pcVar19 = "You feel like bouncing off a solid wall!";
          goto LAB_00259a0c;
        }
        bVar4 = on_level(&u.uz,&dungeon_topology.d_knox_level);
        if (bVar4 == '\0') {
          bVar4 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
          if ((0 < iVar17) && (bVar4 != '\0')) goto LAB_00259bb8;
        }
        else if (0 < iVar17) {
LAB_00259bb8:
          pline("You shudder for a moment.");
          iVar20 = 1;
          goto LAB_00259a1d;
        }
        bVar4 = In_quest(&u.uz);
        iVar20 = 0;
        if ((0 < iVar17) && (bVar4 != '\0')) {
          iVar17 = iVar17 + dungeons[u.uz.dnum].depth_start + -1;
        }
        goto LAB_00259a1d;
      }
      bVar4 = digit((char)local_238);
      if (bVar4 != '\0') goto LAB_002597c2;
      if ((char)local_238 == '-') {
        bVar4 = digit(local_238._1_1_);
        if ((8 < uVar18) || (bVar4 != '\0')) goto LAB_002597c2;
      }
      else if (8 < uVar18) goto LAB_002597c2;
      uVar18 = uVar18 + 1;
    } while( true );
  }
  bVar1 = false;
LAB_00259a2c:
  iVar17 = random_teleport_level();
  sVar3 = depth(&u.uz);
  if (iVar17 != sVar3) goto LAB_00259a43;
LAB_00259aa1:
  pcVar19 = "You shudder for a moment.";
LAB_00259b53:
  pline(pcVar19);
  return;
LAB_002597c2:
  if (uVar18 < 9) {
    cVar5 = yn_function("Go to Nowhere.  Are you sure?","ynq",'q');
    iVar20 = 1;
    iVar15 = 1;
    if (cVar5 != 'y') goto LAB_00259a1b;
    pcVar19 = "scream";
    if ((youmonst.data)->msound == '\0') {
      pcVar19 = "writhe";
    }
    iVar17 = 0;
    pline("You %s in agony as your body begins to warp...",pcVar19);
    (*windowprocs.win_pause)(P_MESSAGE);
    pline("You cease to exist.");
    if (invent != (obj *)0x0) {
      pcVar19 = surface((int)u.ux,(int)u.uy);
      pline("Your possessions land on the %s with a thud.",pcVar19);
    }
    killer_format = 2;
    killer = "committed suicide";
    done(0);
    pline("An energized cloud of dust begins to coalesce.");
    pline("Your body rematerializes%s.");
  }
  else {
LAB_00259a1b:
    iVar20 = iVar15;
    iVar17 = 0;
  }
LAB_00259a1d:
  if (iVar20 != 0) {
    if (iVar20 != 4) {
      return;
    }
    goto LAB_00259a2c;
  }
LAB_00259a43:
  bVar4 = next_to_u();
  if (bVar4 != '\0') {
    if (u.uz.dnum != dungeon_topology.d_astral_level.dnum) {
      pcVar19 = (char *)0x0;
      killer = (char *)0x0;
      if ((iVar17 < 0) && (!bVar1)) {
        if (u.ushops0[0] != '\0') {
          in_mklev = '\x01';
          u_left_shop(u.ushops0,'\x01');
          u.ushops[0] = '\0';
          u.ushops0[0] = '\0';
          in_mklev = '\0';
        }
        if (iVar17 < -9) {
          pline("You arrive in heaven.");
          verbalize("Thou art early, but we\'ll admit thee.");
          killer_format = 2;
          killer = "went to heaven prematurely";
        }
        else if (iVar17 == -9) {
          pline("You feel deliriously happy. ");
          pline("(In fact, you\'re on Cloud 9!) ");
          (*windowprocs.win_pause)(P_MESSAGE);
        }
        else {
          pline("You are now high above the clouds...");
        }
        if (killer == (char *)0x0) {
          pcVar19 = "float gently down to earth";
          if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
               ((youmonst.data)->mlet != '\x05')) &&
              (pcVar19 = "fly down to the ground", u.uprops[0x3c].extrinsic == 0)) &&
             ((((youmonst.data)->mflags1 & 1) == 0 &&
              ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))))) {
            pcVar19 = (char *)0x0;
            pline("Unfortunately, you don\'t know how to fly.");
            pline("You plummet a few thousand feet to your death.");
            sprintf((char *)&local_238,"teleported out of the dungeon and fell to %s death",
                    *(undefined8 *)
                     ((long)&genders[0].his + (ulong)((uint)(flags.female != '\0') * 0x30)));
            killer_format = 2;
            killer = (char *)&local_238;
          }
        }
        else {
          pcVar19 = (char *)0x0;
        }
      }
      dVar2 = u.uz;
      if (killer != (char *)0x0) {
        bVar13 = 0xf6;
        if (-10 < iVar17) {
          bVar13 = 0;
        }
        u.uz = (d_level)((ushort)bVar13 << 8);
        done(0);
        pcVar19 = "find yourself back on the surface";
      }
      u.uz = dVar2;
      if (pcVar19 == (char *)0x0) {
        u.uz.dnum = dVar2.dnum;
        lVar10 = (long)u.uz.dnum;
        bVar21 = u.uz.dnum == dungeon_topology.d_medusa_level.dnum;
        if ((bVar21) &&
           (iVar15 = dungeons[lVar10].depth_start, xVar6 = dunlevs_in_dungeon(&u.uz),
           xVar6 + iVar15 <= iVar17)) {
          if ((flags.debug == '\0') || (!bVar1)) {
            find_hell(&local_23c);
          }
        }
        else {
          if ((flags.debug == '\0') &&
             ((bVar4 = In_hell(&u.uz), bVar4 != '\0' && ((u.uevent._1_1_ & 2) == 0)))) {
            iVar15 = dungeons[u.uz.dnum].depth_start;
            xVar6 = dunlevs_in_dungeon(&u.uz);
            if (xVar6 + iVar15 + -1 <= iVar17) {
              iVar15 = dungeons[u.uz.dnum].depth_start;
              xVar6 = dunlevs_in_dungeon(&u.uz);
              iVar17 = iVar15 + xVar6 + -2;
              pline("Sorry...");
            }
          }
          bVar4 = In_quest(&u.uz);
          if ((bVar4 != '\0') && (sVar3 = depth(&dungeon_topology.d_qstart_level), iVar17 < sVar3))
          {
            sVar3 = depth(&dungeon_topology.d_qstart_level);
            iVar17 = (int)sVar3;
          }
          if ((flags.debug == '\0') || (!bVar1)) {
            get_level(&local_23c,iVar17);
          }
        }
      }
      else {
        pline("You %s.");
        local_23c.dnum = '\0';
        local_23c.dlevel = '\0';
      }
      schedule_goto(&local_23c,'\0','\0',0,(char *)0x0,(char *)0x0);
      if (u.utotype == '\0') {
        return;
      }
      if (flags.mon_moving != '\0') {
        return;
      }
      deferred_goto();
      return;
    }
    xVar6 = dunlevs_in_dungeon(&u.uz);
    if ((iVar17 < 0) &&
       (iVar15 = -(int)xVar6, iVar17 != iVar15 && SBORROW4(iVar17,iVar15) == iVar17 + xVar6 < 0)) {
      local_23c.dlevel = xVar6 + (char)iVar17;
      local_23c.dnum = u.uz.dnum;
      schedule_goto(&local_23c,'\0','\0',0,(char *)0x0,(char *)0x0);
      return;
    }
    pcVar19 = "You can\'t get there from here.";
    goto LAB_00259b53;
  }
  goto LAB_00259aa1;
}

Assistant:

void level_tele(void)
{
	int newlev;
	d_level newlevel;
	const char *escape_by_flying = 0;	/* when surviving dest of -N */
	char buf[BUFSZ];
	boolean force_dest = FALSE;

	if ((u.uhave.amulet || In_endgame(&u.uz) || In_sokoban(&u.uz))
		&& !wizard) {
	    pline("You feel very disoriented for a moment.");
	    return;
	}
	if ((Teleport_control && !Stunned) || wizard) {
	    char qbuf[BUFSZ];
	    int trycnt = 0;

	    strcpy(qbuf, "To what level do you want to teleport?");
	    do {
		if (++trycnt == 2) {

			if (wizard) strcat(qbuf, " [type a number or ? for a menu]");
			else

			strcat(qbuf, " [type a number]");
		}
		getlin(qbuf, buf);
		if (!strcmp(buf,"\033")) {	/* cancelled */
		    if (Confusion && rnl(5)) {
			pline("Oops...");
			goto random_levtport;
		    }
		    return;
		} else if (!strcmp(buf,"*")) {
		    goto random_levtport;
		} else if (Confusion && rnl(5)) {
		    pline("Oops...");
		    goto random_levtport;
		}

		if (wizard && !strcmp(buf,"?")) {
		    schar destlev = 0;
		    xchar destdnum = 0;

		    if ((newlev = (int)print_dungeon(TRUE, &destlev, &destdnum))) {
			newlevel.dnum = destdnum;
			newlevel.dlevel = destlev;
			if (In_endgame(&newlevel) && !In_endgame(&u.uz)) {
				s_level *first_plane = get_first_elemental_plane();
				sprintf(buf,
				    "Destination is first elemental plane");
				if (!u.uhave.amulet) {
					struct obj *obj;
					obj = mksobj(level, AMULET_OF_YENDOR,
							TRUE, FALSE);
					if (obj) {
						addinv(obj);
						strcat(buf, " with the amulet");
					}
				}
				assign_level(&newlevel, first_plane ? &first_plane->dlevel : NULL);
				pline("%s.", buf);
			}
			force_dest = TRUE;
		    } else return;
		} else

		if ((newlev = lev_by_name(buf)) == 0) newlev = atoi(buf);
	    } while (!newlev && !digit(buf[0]) &&
		     (buf[0] != '-' || !digit(buf[1])) &&
		     trycnt < 10);

	    /* no dungeon escape via this route */
	    if (newlev == 0) {
		if (trycnt >= 10)
		    goto random_levtport;
		if (ynq("Go to Nowhere.  Are you sure?") != 'y') return;
		pline("You %s in agony as your body begins to warp...",
		    is_silent(youmonst.data) ? "writhe" : "scream");
		win_pause_output(P_MESSAGE);
		pline("You cease to exist.");
		if (invent) pline("Your possessions land on the %s with a thud.",
				surface(u.ux, u.uy));
		killer_format = NO_KILLER_PREFIX;
		killer = "committed suicide";
		done(DIED);
		pline("An energized cloud of dust begins to coalesce.");
		pline("Your body rematerializes%s.", invent ?
			", and you gather up all your possessions" : "");
		return;

	    /* only allow jump beyond Dungeons of Doom branch */
	    } else if (!wizard && newlev > 0 && u.uz.dnum != 0) {
		/* random teleport for destination level outside of
		 * the current dungeon branch
		 */
		if (newlev > dungeons[u.uz.dnum].depth_start +
			     dunlevs_in_dungeon(&u.uz)) {
		    pline("You feel like bouncing off a solid wall!");
		    goto random_levtport;
		}
	    }

	    /* if in Knox and the requested level > 0, stay put.
	     * we let negative values requests fall into the "heaven" loop.
	     */
	    if ((Is_knox(&u.uz) || Is_blackmarket(&u.uz)) && newlev > 0) {
		pline("You shudder for a moment.");
		return;
	    }
	    /* if in Quest, the player sees "Home 1", etc., on the status
	     * line, instead of the logical depth of the level.  controlled
	     * level teleport request is likely to be relativized to the
	     * status line, and consequently it should be incremented to
	     * the value of the logical depth of the target level.
	     *
	     * we let negative values requests fall into the "heaven" loop.
	     */
	    if (In_quest(&u.uz) && newlev > 0)
		newlev = newlev + dungeons[u.uz.dnum].depth_start - 1;
	} else { /* involuntary level tele */
 random_levtport:
	    newlev = random_teleport_level();
	    if (newlev == depth(&u.uz)) {
		pline("You shudder for a moment.");
		return;
	    }
	}

	if (!next_to_u()) {
		pline("You shudder for a moment.");
		return;
	}

	if (In_endgame(&u.uz)) {	/* must already be wizard */
	    int llimit = dunlevs_in_dungeon(&u.uz);

	    if (newlev >= 0 || newlev <= -llimit) {
		pline("You can't get there from here.");
		return;
	    }
	    newlevel.dnum = u.uz.dnum;
	    newlevel.dlevel = llimit + newlev;
	    schedule_goto(&newlevel, FALSE, FALSE, 0, NULL, NULL);
	    return;
	}

	killer = 0;		/* still alive, so far... */

	if (newlev < 0 && !force_dest) {
		if (*u.ushops0) {
		    /* take unpaid inventory items off of shop bills */
		    in_mklev = TRUE;	/* suppress map update */
		    u_left_shop(u.ushops0, TRUE);
		    /* you're now effectively out of the shop */
		    *u.ushops0 = *u.ushops = '\0';
		    in_mklev = FALSE;
		}
		if (newlev <= -10) {
			pline("You arrive in heaven.");
			verbalize("Thou art early, but we'll admit thee.");
			killer_format = NO_KILLER_PREFIX;
			killer = "went to heaven prematurely";
		} else if (newlev == -9) {
			pline("You feel deliriously happy. ");
			pline("(In fact, you're on Cloud 9!) ");
			win_pause_output(P_MESSAGE);
		} else
			pline("You are now high above the clouds...");

		if (killer) {
		    ;		/* arrival in heaven is pending */
		} else if (Levitation) {
		    escape_by_flying = "float gently down to earth";
		} else if (Flying) {
		    escape_by_flying = "fly down to the ground";
		} else {
		    pline("Unfortunately, you don't know how to fly.");
		    pline("You plummet a few thousand feet to your death.");
		    sprintf(buf,
			  "teleported out of the dungeon and fell to %s death",
			    uhis());
		    killer = buf;
		    killer_format = NO_KILLER_PREFIX;
		}
	}

	if (killer) {	/* the chosen destination was not survivable */
	    d_level lsav;

	    /* set specific death location; this also suppresses bones */
	    lsav = u.uz;	/* save current level, see below */
	    u.uz.dnum = 0;	/* main dungeon */
	    u.uz.dlevel = (newlev <= -10) ? -10 : 0;	/* heaven or surface */
	    done(DIED);
	    /* can only get here via life-saving (or declining to die in
	       explore|debug mode); the hero has now left the dungeon... */
	    escape_by_flying = "find yourself back on the surface";
	    u.uz = lsav;	/* restore u.uz so escape code works */
	}

	/* calls done(ESCAPED) if newlevel==0 */
	if (escape_by_flying) {
	    pline("You %s.", escape_by_flying);
	    newlevel.dnum = 0;		/* specify main dungeon */
	    newlevel.dlevel = 0;	/* escape the dungeon */
	    /* [dlevel used to be set to 1, but it doesn't make sense to
		teleport out of the dungeon and float or fly down to the
		surface but then actually arrive back inside the dungeon] */
	} else if (u.uz.dnum == medusa_level.dnum &&
	    newlev >= dungeons[u.uz.dnum].depth_start +
						dunlevs_in_dungeon(&u.uz)) {
	    if (!(wizard && force_dest))
		find_hell(&newlevel);
	} else {
	    /* if invocation did not yet occur, teleporting into
	     * the last level of Gehennom is forbidden.
	     */
	    if (!wizard)
	    if (Inhell && !u.uevent.invoked &&
			newlev >= (dungeons[u.uz.dnum].depth_start +
					dunlevs_in_dungeon(&u.uz) - 1)) {
		newlev = dungeons[u.uz.dnum].depth_start +
					dunlevs_in_dungeon(&u.uz) - 2;
		pline("Sorry...");
	    }
	    /* no teleporting out of quest dungeon */
	    if (In_quest(&u.uz) && newlev < depth(&qstart_level))
		newlev = depth(&qstart_level);
	    /* the player thinks of levels purely in logical terms, so
	     * we must translate newlev to a number relative to the
	     * current dungeon.
	     */
	    if (!(wizard && force_dest))
		get_level(&newlevel, newlev);
	}
	schedule_goto(&newlevel, FALSE, FALSE, 0, NULL, NULL);
	/* in case player just read a scroll and is about to be asked to
	   call it something, we can't defer until the end of the turn */
	if (u.utotype && !flags.mon_moving) deferred_goto();
}